

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O0

void __thiscall
soplex::SPxEquiliSC<double>::scale(SPxEquiliSC<double> *this,SPxLPBase<double> *lp,bool persistent)

{
  Verbosity VVar1;
  element_type *this_00;
  SPxOut *manip;
  SPxOut *_spxout;
  byte in_DL;
  LPRowSetBase<double> *in_RSI;
  long *in_RDI;
  SVSetBase<double> *vecset;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  bool colFirst;
  double epsilon;
  double rowratio;
  double colratio;
  Verbosity old_verbosity;
  SPxScaler<double> *in_stack_ffffffffffffff28;
  SPxOut *in_stack_ffffffffffffff30;
  SPxOut *in_stack_ffffffffffffff68;
  DataArray<int> *in_stack_ffffffffffffff70;
  DataArray<int> *coScaleExp;
  undefined4 local_70;
  Verbosity local_6c [3];
  Verbosity local_60;
  Verbosity local_5c;
  byte local_55;
  DataArray<int> local_48;
  double local_30;
  double local_28;
  undefined4 local_1c;
  Verbosity local_18;
  byte local_11;
  LPRowSetBase<double> *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  if ((in_RDI[5] != 0) && (VVar1 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 2 < (int)VVar1)) {
    local_18 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
    local_1c = 3;
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_1c);
    soplex::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    soplex::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    soplex::operator<<(in_stack_ffffffffffffff30,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_ffffffffffffff28);
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_18);
  }
  (**(code **)*in_RDI)(in_RDI,local_10);
  local_28 = (double)(**(code **)(*in_RDI + 0x198))(in_RDI,local_10);
  local_30 = (double)(**(code **)(*in_RDI + 0x1a0))(in_RDI,local_10);
  coScaleExp = &local_48;
  SPxScaler<double>::tolerances(in_stack_ffffffffffffff28);
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2d1c1b);
  vecset = (SVSetBase<double> *)Tolerances::epsilon(this_00);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2d1c38);
  local_55 = local_28 < local_30;
  local_48.memFactor = (Real)vecset;
  if ((in_RDI[5] != 0) && (VVar1 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 3 < (int)VVar1)) {
    local_5c = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
    local_60 = 4;
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_60);
    soplex::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff68 =
         soplex::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    (*(local_10->super_SVSetBase<double>).super_ClassArray<soplex::Nonzero<double>_>.
      _vptr_ClassArray[3])(local_10,1);
    soplex::operator<<(in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff70 =
         (DataArray<int> *)
         soplex::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    (*(local_10->super_SVSetBase<double>).super_ClassArray<soplex::Nonzero<double>_>.
      _vptr_ClassArray[4])(local_10,1);
    soplex::operator<<(in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
    soplex::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    soplex::operator<<(in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
    soplex::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    soplex::operator<<(in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
    soplex::operator<<(in_stack_ffffffffffffff30,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_ffffffffffffff28);
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_5c);
  }
  if ((local_55 & 1) == 0) {
    LPRowSetBase<double>::rowSet(local_10);
    computeEquiExpVec(vecset,coScaleExp,in_stack_ffffffffffffff70,(double)in_stack_ffffffffffffff68)
    ;
    if ((*(byte *)((long)in_RDI + 0x21) & 1) != 0) {
      LPColSetBase<double>::colSet((LPColSetBase<double> *)(local_10 + 1));
      computeEquiExpVec(vecset,coScaleExp,in_stack_ffffffffffffff70,
                        (double)in_stack_ffffffffffffff68);
    }
  }
  else {
    LPColSetBase<double>::colSet((LPColSetBase<double> *)(local_10 + 1));
    computeEquiExpVec(vecset,coScaleExp,in_stack_ffffffffffffff70,(double)in_stack_ffffffffffffff68)
    ;
    if ((*(byte *)((long)in_RDI + 0x21) & 1) != 0) {
      LPRowSetBase<double>::rowSet(local_10);
      computeEquiExpVec(vecset,coScaleExp,in_stack_ffffffffffffff70,
                        (double)in_stack_ffffffffffffff68);
    }
  }
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_10);
  if ((in_RDI[5] != 0) && (VVar1 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 4 < (int)VVar1)) {
    local_6c[2] = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
    local_6c[1] = 5;
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],local_6c + 1);
    soplex::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    (**(code **)(*in_RDI + 0x188))();
    soplex::operator<<(in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
    soplex::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    (**(code **)(*in_RDI + 400))();
    soplex::operator<<(in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
    soplex::operator<<(in_stack_ffffffffffffff30,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_ffffffffffffff28);
    soplex::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    (**(code **)(*in_RDI + 0x178))();
    soplex::operator<<(in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
    soplex::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    (**(code **)(*in_RDI + 0x180))();
    soplex::operator<<(in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
    soplex::operator<<(in_stack_ffffffffffffff30,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_ffffffffffffff28);
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],local_6c + 2);
  }
  if ((in_RDI[5] != 0) && (VVar1 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 3 < (int)VVar1)) {
    local_6c[0] = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
    local_70 = 4;
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_70);
    soplex::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    manip = soplex::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    (*(local_10->super_SVSetBase<double>).super_ClassArray<soplex::Nonzero<double>_>.
      _vptr_ClassArray[3])(local_10,0);
    soplex::operator<<(in_stack_ffffffffffffff30,(double)manip);
    _spxout = soplex::operator<<(in_stack_ffffffffffffff30,(char *)manip);
    (*(local_10->super_SVSetBase<double>).super_ClassArray<soplex::Nonzero<double>_>.
      _vptr_ClassArray[4])(local_10,0);
    soplex::operator<<(_spxout,(double)manip);
    soplex::operator<<(_spxout,(char *)manip);
    (**(code **)(*in_RDI + 0x198))(in_RDI,local_10);
    soplex::operator<<(_spxout,(double)manip);
    soplex::operator<<(_spxout,(char *)manip);
    (**(code **)(*in_RDI + 0x1a0))(in_RDI,local_10);
    soplex::operator<<(_spxout,(double)manip);
    soplex::operator<<(_spxout,(_func_ostream_ptr_ostream_ptr *)manip);
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],local_6c);
  }
  return;
}

Assistant:

void SPxEquiliSC<R>::scale(SPxLPBase<R>& lp, bool persistent)
{

   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Equilibrium scaling LP" <<
                 (persistent ? " (persistent)" : "") << std::endl;)

   this->setup(lp);

   /* We want to do the direction first, which has a lower maximal ratio,
    * since the lowest value in the scaled matrix is bounded from below by
    * the inverse of the maximum ratio of the direction that is done first
    * Example:
    *
    *                     Rowratio
    *            0.1  1   10
    *            10   1   10
    *
    * Colratio   100  1
    *
    * Row first =>         Col next =>
    *            0.1  1          0.1  1
    *            1    0.1        1    0.1
    *
    * Col first =>         Row next =>
    *            0.01 1          0.01 1
    *            1    1          1    1
    *
    */
   R colratio = this->maxColRatio(lp);
   R rowratio = this->maxRowRatio(lp);
   R epsilon = this->tolerances()->epsilon();

   bool colFirst = colratio < rowratio;

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "before scaling:"
                 << " min= " << lp.minAbsNzo()
                 << " max= " << lp.maxAbsNzo()
                 << " col-ratio= " << colratio
                 << " row-ratio= " << rowratio
                 << std::endl;)

   if(colFirst)
   {
      computeEquiExpVec(lp.colSet(), *this->m_activeRowscaleExp, *this->m_activeColscaleExp, epsilon);

      if(this->m_doBoth)
         computeEquiExpVec(lp.rowSet(), *this->m_activeColscaleExp, *this->m_activeRowscaleExp, epsilon);
   }
   else
   {
      computeEquiExpVec(lp.rowSet(), *this->m_activeColscaleExp, *this->m_activeRowscaleExp, epsilon);

      if(this->m_doBoth)
         computeEquiExpVec(lp.colSet(), *this->m_activeRowscaleExp, *this->m_activeColscaleExp, epsilon);
   }

   /* scale */
   this->applyScaling(lp);

   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Row scaling min= " << this->minAbsRowscale()
                 << " max= " << this->maxAbsRowscale()
                 << std::endl
                 << "Col scaling min= " << this->minAbsColscale()
                 << " max= " << this->maxAbsColscale()
                 << std::endl;)

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "after scaling: "
                 << " min= " << lp.minAbsNzo(false)
                 << " max= " << lp.maxAbsNzo(false)
                 << " col-ratio= " << this->maxColRatio(lp)
                 << " row-ratio= " << this->maxRowRatio(lp)
                 << std::endl;)

}